

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineLayoutVk.cpp
# Opt level: O0

void __thiscall
Diligent::PipelineLayoutVk::Create
          (PipelineLayoutVk *this,RenderDeviceVkImpl *pDeviceVk,
          RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *ppSignatures,
          Uint32 SignatureCount)

{
  DESCRIPTOR_SET_ID SetId_00;
  byte bVar1;
  value_type_conflict4 vVar2;
  bool bVar3;
  byte bVar4;
  Uint32 UVar5;
  VkPipelineLayout_T *pVVar6;
  Char *pCVar7;
  PipelineResourceSignatureVkImpl *pPVar8;
  reference pvVar9;
  const_iterator pDVar10;
  VkDescriptorSetLayout pVVar11;
  reference ppVVar12;
  PipelineResourceSignatureDesc *pPVar13;
  uint *puVar14;
  VulkanPhysicalDevice *this_00;
  VkPhysicalDeviceProperties *pVVar15;
  VulkanLogicalDevice *this_01;
  undefined4 in_register_0000000c;
  char (*Args_1) [50];
  ulong __n;
  char *in_R8;
  pointer local_240;
  PipelineLayoutWrapper local_1e8;
  undefined1 local_1d0 [8];
  VkPipelineLayoutCreateInfo PipelineLayoutCI;
  string msg_3;
  VkPhysicalDeviceLimits *Limits;
  string msg_2;
  DESCRIPTOR_SET_ID SetId;
  const_iterator __end2;
  const_iterator __begin2;
  undefined8 local_130;
  initializer_list<Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID> local_128;
  initializer_list<Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID> *local_118;
  initializer_list<Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID> *__range2;
  string msg_1;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *pSignature;
  Uint32 BindInd;
  Uint32 DynamicStorageBufferCount;
  Uint32 DynamicUniformBufferCount;
  Uint32 DescSetLayoutCount;
  array<VkDescriptorSetLayout_T_*,_16UL> DescSetLayouts;
  undefined1 local_48 [8];
  string msg;
  Uint32 SignatureCount_local;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *ppSignatures_local;
  RenderDeviceVkImpl *pDeviceVk_local;
  PipelineLayoutVk *this_local;
  
  Args_1 = (char (*) [50])CONCAT44(in_register_0000000c,SignatureCount);
  msg.field_2._12_4_ = SignatureCount;
  if ((this->m_DescrSetCount != '\0') ||
     (pVVar6 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkPipelineLayout_T_
                         ((VulkanObjectWrapper *)this), pVVar6 != (VkPipelineLayout_T *)0x0)) {
    FormatString<char[44]>
              ((string *)local_48,(char (*) [44])"This pipeline layout is already initialized");
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (char (*) [50])0x40;
    DebugAssertionFailed
              (pCVar7,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
               ,0x40);
    std::__cxx11::string::~string((string *)local_48);
  }
  DynamicStorageBufferCount = 0;
  BindInd = 0;
  pSignature._4_4_ = 0;
  for (pSignature._0_4_ = 0; (uint)pSignature < (uint)msg.field_2._12_4_;
      pSignature._0_4_ = (uint)pSignature + 1) {
    Args_1 = (char (*) [50])((ulong)(uint)pSignature * 8);
    msg_1.field_2._8_8_ = ppSignatures + (uint)pSignature;
    pPVar8 = Diligent::RefCntAutoPtr::operator_cast_to_PipelineResourceSignatureVkImpl_
                       ((RefCntAutoPtr *)msg_1.field_2._8_8_);
    UVar5 = DynamicStorageBufferCount;
    if (pPVar8 != (PipelineResourceSignatureVkImpl *)0x0) {
      bVar1 = std::numeric_limits<unsigned_char>::max();
      if (bVar1 < UVar5) {
        FormatString<char[30],unsigned_int,char[42]>
                  ((string *)&__range2,(Diligent *)"Descriptor set layout count (",
                   (char (*) [30])&DynamicStorageBufferCount,
                   (uint *)") exceeds the maximum representable value",(char (*) [42])in_R8);
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar7,"Create",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
                   ,0x50);
        std::__cxx11::string::~string((string *)&__range2);
      }
      vVar2 = (value_type_conflict4)DynamicStorageBufferCount;
      pvVar9 = std::array<unsigned_char,_8UL>::operator[]
                         (&this->m_FirstDescrSetIndex,(ulong)(uint)pSignature);
      *pvVar9 = vVar2;
      __begin2 = (const_iterator)0x0;
      local_130 = 1;
      local_128._M_array = (iterator)&__begin2;
      local_128._M_len = 2;
      local_118 = &local_128;
      __end2 = std::initializer_list<Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID>::
               begin(local_118);
      pDVar10 = std::initializer_list<Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID>
                ::end(local_118);
      for (; __end2 != pDVar10; __end2 = __end2 + 1) {
        SetId_00 = *__end2;
        pPVar8 = RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator->
                           ((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)
                            msg_1.field_2._8_8_);
        bVar3 = PipelineResourceSignatureVkImpl::HasDescriptorSet(pPVar8,SetId_00);
        if (bVar3) {
          pPVar8 = RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator->
                             ((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)
                              msg_1.field_2._8_8_);
          pVVar11 = PipelineResourceSignatureVkImpl::GetVkDescriptorSetLayout(pPVar8,SetId_00);
          __n = (ulong)DynamicStorageBufferCount;
          DynamicStorageBufferCount = DynamicStorageBufferCount + 1;
          ppVVar12 = std::array<VkDescriptorSetLayout_T_*,_16UL>::operator[]
                               ((array<VkDescriptorSetLayout_T_*,_16UL> *)&DynamicUniformBufferCount
                                ,__n);
          *ppVVar12 = pVVar11;
        }
      }
      pPVar8 = RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator->
                         ((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)
                          msg_1.field_2._8_8_);
      UVar5 = PipelineResourceSignatureVkImpl::GetDynamicUniformBufferCount(pPVar8);
      BindInd = UVar5 + BindInd;
      pPVar8 = RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator->
                         ((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)
                          msg_1.field_2._8_8_);
      UVar5 = PipelineResourceSignatureVkImpl::GetDynamicStorageBufferCount(pPVar8);
      pSignature._4_4_ = UVar5 + pSignature._4_4_;
      pPVar8 = RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator->
                         ((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)
                          msg_1.field_2._8_8_);
      pPVar13 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                           *)pPVar8);
      msg_2.field_2._12_4_ = ZEXT14(pPVar13->BindingIndex);
      puVar14 = std::max<unsigned_int>
                          (&this->m_DbgMaxBindIndex,(uint *)(msg_2.field_2._M_local_buf + 0xc));
      Args_1 = (char (*) [50])(ulong)*puVar14;
      this->m_DbgMaxBindIndex = *puVar14;
    }
  }
  if (0x10 < DynamicStorageBufferCount) {
    FormatString<char[26],char[50]>
              ((string *)&Limits,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"DescSetLayoutCount <= MAX_RESOURCE_SIGNATURES * 2",Args_1);
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
               ,0x5f);
    std::__cxx11::string::~string((string *)&Limits);
  }
  this_00 = RenderDeviceVkImpl::GetPhysicalDevice(pDeviceVk);
  pVVar15 = VulkanUtilities::VulkanPhysicalDevice::GetProperties(this_00);
  if ((pVVar15->limits).maxBoundDescriptorSets < DynamicStorageBufferCount) {
    in_R8 = "The total number of descriptor sets (";
    LogError<true,char[38],unsigned_int,char[53],unsigned_int,char[2]>
              (false,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
               ,0x65,(char (*) [38])"The total number of descriptor sets (",
               &DynamicStorageBufferCount,
               (char (*) [53])") used by the pipeline layout exceeds device limit (",
               &(pVVar15->limits).maxBoundDescriptorSets,(char (*) [2])0xf65f2d);
  }
  if ((pVVar15->limits).maxDescriptorSetUniformBuffersDynamic < BindInd) {
    in_R8 = "The number of dynamic uniform buffers  (";
    LogError<true,char[41],unsigned_int,char[53],unsigned_int,char[2]>
              (false,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
               ,0x6b,(char (*) [41])"The number of dynamic uniform buffers  (",&BindInd,
               (char (*) [53])") used by the pipeline layout exceeds device limit (",
               &(pVVar15->limits).maxDescriptorSetUniformBuffersDynamic,(char (*) [2])0xf65f2d);
  }
  if ((pVVar15->limits).maxDescriptorSetStorageBuffersDynamic < pSignature._4_4_) {
    in_R8 = "The number of dynamic storage buffers (";
    LogError<true,char[40],unsigned_int,char[53],unsigned_int,char[2]>
              (false,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
               ,0x71,(char (*) [40])"The number of dynamic storage buffers (",
               (uint *)((long)&pSignature + 4),
               (char (*) [53])") used by the pipeline layout exceeds device limit (",
               &(pVVar15->limits).maxDescriptorSetStorageBuffersDynamic,(char (*) [2])0xf65f2d);
  }
  bVar1 = this->m_DescrSetCount;
  bVar4 = std::numeric_limits<unsigned_char>::max();
  if (bVar4 < bVar1) {
    FormatString<char[23],unsigned_int,char[42]>
              ((string *)&PipelineLayoutCI.pPushConstantRanges,(Diligent *)"Descriptor set count (",
               (char (*) [23])&DynamicStorageBufferCount,
               (uint *)") exceeds the maximum representable value",(char (*) [42])in_R8);
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
               ,0x75);
    std::__cxx11::string::~string((string *)&PipelineLayoutCI.pPushConstantRanges);
  }
  memset(local_1d0,0,0x30);
  local_1d0._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  PipelineLayoutCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  PipelineLayoutCI._4_4_ = 0;
  PipelineLayoutCI.pNext._0_4_ = 0;
  PipelineLayoutCI.pNext._4_4_ = DynamicStorageBufferCount;
  if (DynamicStorageBufferCount == 0) {
    local_240 = (pointer)0x0;
  }
  else {
    local_240 = std::array<VkDescriptorSetLayout_T_*,_16UL>::data
                          ((array<VkDescriptorSetLayout_T_*,_16UL> *)&DynamicUniformBufferCount);
  }
  PipelineLayoutCI._16_8_ = local_240;
  PipelineLayoutCI.pSetLayouts._0_4_ = 0;
  PipelineLayoutCI.pushConstantRangeCount = 0;
  PipelineLayoutCI._36_4_ = 0;
  this_01 = RenderDeviceVkImpl::GetLogicalDevice(pDeviceVk);
  VulkanUtilities::VulkanLogicalDevice::CreatePipelineLayout
            (&local_1e8,this_01,(VkPipelineLayoutCreateInfo *)local_1d0,"");
  VulkanUtilities::
  VulkanObjectWrapper<VkPipelineLayout_T_*,_(VulkanUtilities::VulkanHandleTypeId)11>::operator=
            (&this->m_VkPipelineLayout,&local_1e8);
  VulkanUtilities::
  VulkanObjectWrapper<VkPipelineLayout_T_*,_(VulkanUtilities::VulkanHandleTypeId)11>::
  ~VulkanObjectWrapper(&local_1e8);
  this->m_DescrSetCount = (Uint8)DynamicStorageBufferCount;
  return;
}

Assistant:

void PipelineLayoutVk::Create(RenderDeviceVkImpl* pDeviceVk, RefCntAutoPtr<PipelineResourceSignatureVkImpl> ppSignatures[], Uint32 SignatureCount) noexcept(false)
{
    VERIFY(m_DescrSetCount == 0 && !m_VkPipelineLayout, "This pipeline layout is already initialized");

    std::array<VkDescriptorSetLayout, MAX_RESOURCE_SIGNATURES * PipelineResourceSignatureVkImpl::MAX_DESCRIPTOR_SETS> DescSetLayouts;

    Uint32 DescSetLayoutCount        = 0;
    Uint32 DynamicUniformBufferCount = 0;
    Uint32 DynamicStorageBufferCount = 0;

    for (Uint32 BindInd = 0; BindInd < SignatureCount; ++BindInd)
    {
        // Signatures are arranged by binding index by PipelineStateBase::CopyResourceSignatures
        const auto& pSignature = ppSignatures[BindInd];
        if (pSignature == nullptr)
            continue;

        VERIFY(DescSetLayoutCount <= std::numeric_limits<FirstDescrSetIndexArrayType::value_type>::max(),
               "Descriptor set layout count (", DescSetLayoutCount, ") exceeds the maximum representable value");
        m_FirstDescrSetIndex[BindInd] = static_cast<FirstDescrSetIndexArrayType::value_type>(DescSetLayoutCount);

        for (auto SetId : {PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_STATIC_MUTABLE, PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC})
        {
            if (pSignature->HasDescriptorSet(SetId))
                DescSetLayouts[DescSetLayoutCount++] = pSignature->GetVkDescriptorSetLayout(SetId);
        }

        DynamicUniformBufferCount += pSignature->GetDynamicUniformBufferCount();
        DynamicStorageBufferCount += pSignature->GetDynamicStorageBufferCount();
#ifdef DILIGENT_DEBUG
        m_DbgMaxBindIndex = std::max(m_DbgMaxBindIndex, Uint32{pSignature->GetDesc().BindingIndex});
#endif
    }
    VERIFY_EXPR(DescSetLayoutCount <= MAX_RESOURCE_SIGNATURES * 2);

    const auto& Limits = pDeviceVk->GetPhysicalDevice().GetProperties().limits;
    if (DescSetLayoutCount > Limits.maxBoundDescriptorSets)
    {
        LOG_ERROR_AND_THROW("The total number of descriptor sets (", DescSetLayoutCount,
                            ") used by the pipeline layout exceeds device limit (", Limits.maxBoundDescriptorSets, ")");
    }

    if (DynamicUniformBufferCount > Limits.maxDescriptorSetUniformBuffersDynamic)
    {
        LOG_ERROR_AND_THROW("The number of dynamic uniform buffers  (", DynamicUniformBufferCount,
                            ") used by the pipeline layout exceeds device limit (", Limits.maxDescriptorSetUniformBuffersDynamic, ")");
    }

    if (DynamicStorageBufferCount > Limits.maxDescriptorSetStorageBuffersDynamic)
    {
        LOG_ERROR_AND_THROW("The number of dynamic storage buffers (", DynamicStorageBufferCount,
                            ") used by the pipeline layout exceeds device limit (", Limits.maxDescriptorSetStorageBuffersDynamic, ")");
    }

    VERIFY(m_DescrSetCount <= std::numeric_limits<decltype(m_DescrSetCount)>::max(),
           "Descriptor set count (", DescSetLayoutCount, ") exceeds the maximum representable value");

    VkPipelineLayoutCreateInfo PipelineLayoutCI = {};

    PipelineLayoutCI.sType                  = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
    PipelineLayoutCI.pNext                  = nullptr;
    PipelineLayoutCI.flags                  = 0; // reserved for future use
    PipelineLayoutCI.setLayoutCount         = DescSetLayoutCount;
    PipelineLayoutCI.pSetLayouts            = DescSetLayoutCount ? DescSetLayouts.data() : nullptr;
    PipelineLayoutCI.pushConstantRangeCount = 0;
    PipelineLayoutCI.pPushConstantRanges    = nullptr;
    m_VkPipelineLayout                      = pDeviceVk->GetLogicalDevice().CreatePipelineLayout(PipelineLayoutCI);

    m_DescrSetCount = static_cast<Uint8>(DescSetLayoutCount);
}